

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall PrintC::pushType(PrintC *this,Datatype *ct)

{
  allocator local_61;
  string local_60 [32];
  Atom local_40;
  Datatype *local_18;
  Datatype *ct_local;
  PrintC *this_local;
  
  local_18 = ct;
  ct_local = (Datatype *)this;
  (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6e])(this,ct,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  PrintLanguage::Atom::Atom(&local_40,(string *)local_60,blanktoken,no_color);
  PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6f])(this,local_18);
  return;
}

Assistant:

void PrintC::pushType(const Datatype *ct)

{
  pushTypeStart(ct,true);				// Print type (as if for a cast)
  pushAtom(Atom("",blanktoken,EmitXml::no_color));
  pushTypeEnd(ct);
}